

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O1

void __thiscall NaVector::NaVector(NaVector *this,uint n)

{
  uint uVar1;
  NaReal *pNVar2;
  ulong uVar3;
  
  this->_vptr_NaVector = (_func_int **)&PTR__NaVector_00177ae0;
  this->bOwnStorage = true;
  pNVar2 = (NaReal *)operator_new__((ulong)n << 3);
  this->pVect = pNVar2;
  this->nDim = n;
  if (n != 0) {
    uVar3 = 0;
    do {
      this->pVect[uVar3] = 0.0;
      uVar3 = uVar3 + 1;
      uVar1 = (*this->_vptr_NaVector[6])(this);
    } while (uVar3 < uVar1);
  }
  return;
}

Assistant:

NaVector::NaVector (unsigned n)
{
    // Create the vector
    bOwnStorage = true;
    pVect = new NaReal[n];
    nDim = n;

    // Initialize items by zero
    init_zero();
}